

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

ssh_key * rsa2_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  _Bool _Var1;
  RSAKey *key;
  mp_int *pmVar2;
  RSAKey *rsa;
  
  key = (RSAKey *)safemalloc(1,0x48,0);
  (key->sshk).vt = &ssh_rsa;
  key->comment = (char *)0x0;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->modulus = pmVar2;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->exponent = pmVar2;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->private_exponent = pmVar2;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->iqmp = pmVar2;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->p = pmVar2;
  pmVar2 = BinarySource_get_mp_ssh2(src->binarysource_);
  key->q = pmVar2;
  if ((src->binarysource_->err == BSE_NO_ERROR) && (_Var1 = rsa_verify(key), _Var1)) {
    return &key->sshk;
  }
  freersakey(key);
  safefree(key);
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *rsa2_new_priv_openssh(const ssh_keyalg *self,
                                      BinarySource *src)
{
    RSAKey *rsa;

    rsa = snew(RSAKey);
    rsa->sshk.vt = &ssh_rsa;
    rsa->comment = NULL;

    rsa->modulus = get_mp_ssh2(src);
    rsa->exponent = get_mp_ssh2(src);
    rsa->private_exponent = get_mp_ssh2(src);
    rsa->iqmp = get_mp_ssh2(src);
    rsa->p = get_mp_ssh2(src);
    rsa->q = get_mp_ssh2(src);

    if (get_err(src) || !rsa_verify(rsa)) {
        rsa2_freekey(&rsa->sshk);
        return NULL;
    }

    return &rsa->sshk;
}